

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_32sto3u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  OPJ_INT32 OVar6;
  sbyte sVar7;
  ulong uVar8;
  byte *pbVar9;
  uint local_4c;
  int remaining;
  uint trailing;
  OPJ_UINT32 src7;
  OPJ_UINT32 src6;
  OPJ_UINT32 src5;
  OPJ_UINT32 src4;
  OPJ_UINT32 src3;
  OPJ_UINT32 src2;
  OPJ_UINT32 src1;
  OPJ_UINT32 src0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_BYTE *pDst_local;
  OPJ_INT32 *pSrc_local;
  
  length_local = (OPJ_SIZE_T)pDst;
  for (_src1 = 0; _src1 < (length & 0xfffffffffffffff8); _src1 = _src1 + 8) {
    uVar1 = pSrc[_src1 + 2];
    iVar2 = pSrc[_src1 + 3];
    iVar3 = pSrc[_src1 + 4];
    uVar4 = pSrc[_src1 + 5];
    iVar5 = pSrc[_src1 + 6];
    OVar6 = pSrc[_src1 + 7];
    *(byte *)length_local =
         (byte)(pSrc[_src1] << 5) | (byte)(pSrc[_src1 + 1] << 2) | (byte)(uVar1 >> 1);
    pbVar9 = (byte *)(length_local + 2);
    *(byte *)(length_local + 1) =
         (byte)(uVar1 << 7) | (byte)(iVar2 << 4) | (byte)(iVar3 << 1) | (byte)(uVar4 >> 2);
    length_local = length_local + 3;
    *pbVar9 = (byte)(uVar4 << 6) | (byte)(iVar5 << 3) | (byte)OVar6;
  }
  if ((length & 7) != 0) {
    uVar8 = length & 7;
    local_4c = pSrc[_src1];
    sVar7 = 5;
    pbVar9 = (byte *)length_local;
    if (1 < uVar8) {
      local_4c = pSrc[_src1 + 1] | local_4c << 3;
      sVar7 = 2;
      if (2 < uVar8) {
        pbVar9 = (byte *)(length_local + 1);
        *(byte *)length_local = (byte)((uint)pSrc[_src1 + 2] >> 1) | (byte)(local_4c << 2);
        local_4c = pSrc[_src1 + 2] & 1;
        sVar7 = 7;
        if (3 < uVar8) {
          local_4c = pSrc[_src1 + 3] | local_4c << 3;
          sVar7 = 4;
          if (4 < uVar8) {
            local_4c = pSrc[_src1 + 4] | local_4c << 3;
            sVar7 = 1;
            if (5 < uVar8) {
              *pbVar9 = (byte)((uint)pSrc[_src1 + 5] >> 2) | (byte)(local_4c << 1);
              local_4c = pSrc[_src1 + 5] & 3;
              sVar7 = 6;
              pbVar9 = (byte *)(length_local + 2);
              if (6 < uVar8) {
                local_4c = pSrc[_src1 + 6] | local_4c << 3;
                sVar7 = 3;
              }
            }
          }
        }
      }
    }
    length_local = (OPJ_SIZE_T)pbVar9;
    if (sVar7 != 8) {
      *(char *)length_local = (char)(local_4c << sVar7);
    }
  }
  return;
}

Assistant:

static void tif_32sto3u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i+4];
		OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i+5];
		OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i+6];
		OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i+7];
			
		*pDst++ = (OPJ_BYTE)((src0 << 5) | (src1 << 2) | (src2 >> 1));
		*pDst++ = (OPJ_BYTE)((src2 << 7) | (src3 << 4) | (src4 << 1) | (src5 >> 2));
		*pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 << 3) | (src7));
	}
		
	if (length & 7U) {
		unsigned int trailing = 0U;
		int remaining = 8U;
		length &= 7U;
		PUTBITS((OPJ_UINT32)pSrc[i+0], 3)
		if (length > 1U) {
			PUTBITS((OPJ_UINT32)pSrc[i+1], 3)
			if (length > 2U) {
				PUTBITS((OPJ_UINT32)pSrc[i+2], 3)
				if (length > 3U) {
					PUTBITS((OPJ_UINT32)pSrc[i+3], 3)
					if (length > 4U) {
						PUTBITS((OPJ_UINT32)pSrc[i+4], 3)
						if (length > 5U) {
							PUTBITS((OPJ_UINT32)pSrc[i+5], 3)
							if (length > 6U) {
								PUTBITS((OPJ_UINT32)pSrc[i+6], 3)
							}
						}
					}
				}
			}
		}
		FLUSHBITS()
	}
}